

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

void __thiscall
Catch::TestSpec::NamePattern::NamePattern(NamePattern *this,string *name,string *filterString)

{
  string *in_RDI;
  Choice in_stack_00000014;
  string *in_stack_00000018;
  WildcardPattern *in_stack_00000020;
  Pattern *in_stack_ffffffffffffffb0;
  string *in_stack_ffffffffffffffc8;
  
  Pattern::Pattern(in_stack_ffffffffffffffb0,in_RDI);
  *(undefined ***)in_RDI = &PTR__NamePattern_00277e58;
  toLower(in_stack_ffffffffffffffc8);
  WildcardPattern::WildcardPattern(in_stack_00000020,in_stack_00000018,in_stack_00000014);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return;
}

Assistant:

TestSpec::NamePattern::NamePattern( std::string const& name, std::string const& filterString )
    : Pattern( filterString )
    , m_wildcardPattern( toLower( name ), CaseSensitive::No )
    {}